

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_bddPickOneCube(DdManager *ddm,DdNode *node,char *string)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  long lVar3;
  ulong uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint *puVar7;
  int local_34;
  
  local_34 = 0;
  if (node != (DdNode *)0x0 && string != (char *)0x0) {
    pDVar1 = ddm->one;
    pDVar5 = (DdNode *)((ulong)pDVar1 ^ 1);
    if (pDVar5 != node) {
      for (lVar3 = 0; lVar3 < ddm->size; lVar3 = lVar3 + 1) {
        string[lVar3] = '\x02';
      }
      local_34 = 1;
      while (node != pDVar1) {
        puVar7 = (uint *)((ulong)node & 0xfffffffffffffffe);
        pDVar6 = (DdNode *)((ulong)*(DdNode **)(puVar7 + 4) ^ 1);
        pDVar2 = (DdNode *)((ulong)*(DdNode **)(puVar7 + 6) ^ 1);
        if (((ulong)node & 1) == 0) {
          pDVar6 = *(DdNode **)(puVar7 + 4);
          pDVar2 = *(DdNode **)(puVar7 + 6);
        }
        node = pDVar2;
        if (pDVar6 == pDVar5) {
          string[*puVar7] = '\0';
        }
        else if (pDVar2 == pDVar5) {
          string[*puVar7] = '\x01';
          node = pDVar6;
        }
        else {
          uVar4 = Cudd_Random();
          string[*puVar7] = (byte)(uVar4 >> 0xd) & 1;
          if ((uVar4 >> 0xd & 1) != 0) {
            node = pDVar6;
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

int
Cudd_bddPickOneCube(
  DdManager * ddm,
  DdNode * node,
  char * string)
{
    DdNode *N, *T, *E;
    DdNode *one, *bzero;
    char   dir;
    int    i;

    if (string == NULL || node == NULL) return(0);

    /* The constant 0 function has no on-set cubes. */
    one = DD_ONE(ddm);
    bzero = Cudd_Not(one);
    if (node == bzero) return(0);

    for (i = 0; i < ddm->size; i++) string[i] = 2;

    for (;;) {

        if (node == one) break;

        N = Cudd_Regular(node);

        T = cuddT(N); E = cuddE(N);
        if (Cudd_IsComplement(node)) {
            T = Cudd_Not(T); E = Cudd_Not(E);
        }
        if (T == bzero) {
            string[N->index] = 0;
            node = E;
        } else if (E == bzero) {
            string[N->index] = 1;
            node = T;
        } else {
            dir = (char) ((Cudd_Random() & 0x2000) >> 13);
            string[N->index] = dir;
            node = dir ? T : E;
        }
    }
    return(1);

}